

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

bool deqp::gls::TextureStateQueryTests::anon_unknown_1::es30::isCoreTester(TesterType tester)

{
  undefined1 local_d;
  TesterType tester_local;
  
  local_d = true;
  if (((((tester != TESTER_TEXTURE_SWIZZLE_R) &&
        (local_d = true, tester != TESTER_TEXTURE_SWIZZLE_G)) &&
       (local_d = true, tester != TESTER_TEXTURE_SWIZZLE_B)) &&
      (((local_d = true, tester != TESTER_TEXTURE_SWIZZLE_A &&
        (local_d = true, tester != TESTER_TEXTURE_WRAP_S)) &&
       ((local_d = true, tester != TESTER_TEXTURE_WRAP_T &&
        ((local_d = true, tester != TESTER_TEXTURE_WRAP_R &&
         (local_d = true, tester != TESTER_TEXTURE_MAG_FILTER)))))))) &&
     ((local_d = true, tester != TESTER_TEXTURE_MIN_FILTER &&
      (((((local_d = true, tester != TESTER_TEXTURE_MIN_LOD &&
          (local_d = true, tester != TESTER_TEXTURE_MAX_LOD)) &&
         (local_d = true, tester != TESTER_TEXTURE_BASE_LEVEL)) &&
        ((local_d = true, tester != TESTER_TEXTURE_MAX_LEVEL &&
         (local_d = true, tester != TESTER_TEXTURE_COMPARE_MODE)))) &&
       ((local_d = true, tester != TESTER_TEXTURE_COMPARE_FUNC &&
        (local_d = true, tester != TESTER_TEXTURE_IMMUTABLE_LEVELS)))))))) {
    local_d = tester == TESTER_TEXTURE_IMMUTABLE_FORMAT;
  }
  return local_d;
}

Assistant:

static bool isCoreTester (TesterType tester)
{
	return	tester == TESTER_TEXTURE_SWIZZLE_R			||
			tester == TESTER_TEXTURE_SWIZZLE_G			||
			tester == TESTER_TEXTURE_SWIZZLE_B			||
			tester == TESTER_TEXTURE_SWIZZLE_A			||
			tester == TESTER_TEXTURE_WRAP_S				||
			tester == TESTER_TEXTURE_WRAP_T				||
			tester == TESTER_TEXTURE_WRAP_R				||
			tester == TESTER_TEXTURE_MAG_FILTER			||
			tester == TESTER_TEXTURE_MIN_FILTER			||
			tester == TESTER_TEXTURE_MIN_LOD			||
			tester == TESTER_TEXTURE_MAX_LOD			||
			tester == TESTER_TEXTURE_BASE_LEVEL			||
			tester == TESTER_TEXTURE_MAX_LEVEL			||
			tester == TESTER_TEXTURE_COMPARE_MODE		||
			tester == TESTER_TEXTURE_COMPARE_FUNC		||
			tester == TESTER_TEXTURE_IMMUTABLE_LEVELS	||
			tester == TESTER_TEXTURE_IMMUTABLE_FORMAT;
}